

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O1

void __thiscall xray_re::xr_vbuf::proxy(xr_vbuf *this,xr_vbuf *that,size_t base,size_t n)

{
  fvector3 *pfVar1;
  fvector2 *pfVar2;
  finfluence *pfVar3;
  fcolor *pfVar4;
  
  if (n + base <= (that->super_xr_flexbuf).m_size) {
    clear(this);
    (this->super_xr_flexbuf).m_owner = false;
    (this->super_xr_flexbuf).m_size = n;
    pfVar1 = that->m_points + base;
    if (that->m_points == (fvector3 *)0x0) {
      pfVar1 = (fvector3 *)0x0;
    }
    this->m_points = pfVar1;
    pfVar1 = that->m_normals + base;
    if (that->m_normals == (fvector3 *)0x0) {
      pfVar1 = (fvector3 *)0x0;
    }
    this->m_normals = pfVar1;
    pfVar2 = that->m_texcoords + base;
    if (that->m_texcoords == (fvector2 *)0x0) {
      pfVar2 = (fvector2 *)0x0;
    }
    this->m_texcoords = pfVar2;
    pfVar2 = that->m_lightmaps + base;
    if (that->m_lightmaps == (fvector2 *)0x0) {
      pfVar2 = (fvector2 *)0x0;
    }
    this->m_lightmaps = pfVar2;
    pfVar4 = that->m_colors + base;
    if (that->m_colors == (fcolor *)0x0) {
      pfVar4 = (fcolor *)0x0;
    }
    this->m_colors = pfVar4;
    pfVar3 = that->m_influences + base;
    if (that->m_influences == (finfluence *)0x0) {
      pfVar3 = (finfluence *)0x0;
    }
    this->m_influences = pfVar3;
    make_signature(this);
    return;
  }
  __assert_fail("base + n <= that.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                ,0x39,"void xray_re::xr_vbuf::proxy(const xr_vbuf &, size_t, size_t)");
}

Assistant:

void xr_vbuf::proxy(const xr_vbuf& that, size_t base, size_t n)
{
	xr_assert(base + n <= that.size());
	clear();
	set_owner(false);
	set_size(n);
	m_points = that.m_points ? that.m_points + base : 0;
	m_normals = that.m_normals ? that.m_normals + base : 0;
	m_texcoords = that.m_texcoords ? that.m_texcoords + base : 0;
	m_lightmaps = that.m_lightmaps ? that.m_lightmaps + base : 0;
	m_colors = that.m_colors ? that.m_colors + base : 0;
	m_influences = that.m_influences ? that.m_influences + base : 0;
	make_signature();
}